

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

EVP_MD_CTX *
evp_md_ctx_new_ex(EVP_PKEY *pkey,ASN1_OCTET_STRING *id,OSSL_LIB_CTX *libctx,char *propq)

{
  int iVar1;
  OSSL_LIB_CTX *libctx_00;
  undefined8 in_RCX;
  char *in_RDX;
  long in_RSI;
  EVP_PKEY_CTX *pctx;
  EVP_MD_CTX *ctx;
  EVP_PKEY_CTX *pctx_00;
  
  iVar1 = (int)((ulong)in_RCX >> 0x20);
  pctx_00 = (EVP_PKEY_CTX *)0x0;
  libctx_00 = (OSSL_LIB_CTX *)EVP_MD_CTX_new();
  if ((libctx_00 == (OSSL_LIB_CTX *)0x0) ||
     (pctx_00 = EVP_PKEY_CTX_new_from_pkey(libctx_00,(EVP_PKEY *)pctx_00,(char *)0x2582a4),
     pctx_00 == (EVP_PKEY_CTX *)0x0)) {
    ERR_new();
    ERR_set_debug(in_RDX,iVar1,(char *)libctx_00);
    ERR_set_error(0xd,0xc0100,(char *)0x0);
  }
  else if ((in_RSI == 0) ||
          (iVar1 = EVP_PKEY_CTX_set1_id((EVP_PKEY_CTX *)libctx_00,pctx_00,0), 0 < iVar1)) {
    EVP_MD_CTX_set_pkey_ctx((EVP_MD_CTX *)libctx_00,pctx_00);
    return (EVP_MD_CTX *)libctx_00;
  }
  EVP_PKEY_CTX_free((EVP_PKEY_CTX *)pctx_00);
  EVP_MD_CTX_free((EVP_MD_CTX *)0x258337);
  return (EVP_MD_CTX *)0x0;
}

Assistant:

EVP_MD_CTX *evp_md_ctx_new_ex(EVP_PKEY *pkey, const ASN1_OCTET_STRING *id,
                              OSSL_LIB_CTX *libctx, const char *propq)
{
    EVP_MD_CTX *ctx;
    EVP_PKEY_CTX *pctx = NULL;

    if ((ctx = EVP_MD_CTX_new()) == NULL
        || (pctx = EVP_PKEY_CTX_new_from_pkey(libctx, pkey, propq)) == NULL) {
        ERR_raise(ERR_LIB_ASN1, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (id != NULL && EVP_PKEY_CTX_set1_id(pctx, id->data, id->length) <= 0)
        goto err;

    EVP_MD_CTX_set_pkey_ctx(ctx, pctx);
    return ctx;

 err:
    EVP_PKEY_CTX_free(pctx);
    EVP_MD_CTX_free(ctx);
    return NULL;
}